

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_read1_core(BGZF *fp,bcf1_t *v)

{
  ssize_t sVar1;
  uint local_48;
  int ret;
  uint32_t x [8];
  bcf1_t *v_local;
  BGZF *fp_local;
  
  sVar1 = bgzf_read(fp,&local_48,0x20);
  if ((int)sVar1 == 0x20) {
    bcf_clear(v);
    local_48 = local_48 - 0x18;
    ks_resize(&v->shared,(ulong)local_48);
    ks_resize(&v->indiv,(ulong)(uint)ret);
    v->rid = x[0];
    v->pos = x[1];
    v->rlen = x[2];
    v->qual = (float)x[3];
    *(ulong *)&v->field_0x10 =
         *(ulong *)&v->field_0x10 & 0xffffffff0000ffff | (ulong)(x[4] >> 0x10) << 0x10;
    *(ulong *)&v->field_0x10 =
         *(ulong *)&v->field_0x10 & 0xffffffffffff0000 | (ulong)(x[4] & 0xffff);
    *(ulong *)&v->field_0x10 =
         *(ulong *)&v->field_0x10 & 0xffffff00ffffffff | (ulong)(x[5] >> 0x18) << 0x20;
    *(ulong *)&v->field_0x10 =
         *(ulong *)&v->field_0x10 & 0xffffffffff | (ulong)(x[5] & 0xffffff) << 0x28;
    (v->shared).l = (ulong)local_48;
    (v->indiv).l = (ulong)(uint)ret;
    if ((((v->indiv).l == 0) || ((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28) == 0)) &&
       ((*(ulong *)&v->field_0x10 >> 0x20 & 0xff) != 0)) {
      *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffff00ffffffff;
    }
    bgzf_read(fp,(v->shared).s,(v->shared).l);
    bgzf_read(fp,(v->indiv).s,(v->indiv).l);
    fp_local._4_4_ = 0;
  }
  else if ((int)sVar1 == 0) {
    fp_local._4_4_ = -1;
  }
  else {
    fp_local._4_4_ = -2;
  }
  return fp_local._4_4_;
}

Assistant:

static inline int bcf_read1_core(BGZF *fp, bcf1_t *v)
{
    uint32_t x[8];
    int ret;
    if ((ret = bgzf_read(fp, x, 32)) != 32) {
        if (ret == 0) return -1;
        return -2;
    }
    bcf_clear1(v);
    x[0] -= 24; // to exclude six 32-bit integers
    ks_resize(&v->shared, x[0]);
    ks_resize(&v->indiv, x[1]);
    memcpy(v, x + 2, 16);
    v->n_allele = x[6]>>16; v->n_info = x[6]&0xffff;
    v->n_fmt = x[7]>>24; v->n_sample = x[7]&0xffffff;
    v->shared.l = x[0], v->indiv.l = x[1];

    // silent fix of broken BCFs produced by earlier versions of bcf_subset, prior to and including bd6ed8b4
    if ( (!v->indiv.l || !v->n_sample) && v->n_fmt ) v->n_fmt = 0;

    bgzf_read(fp, v->shared.s, v->shared.l);
    bgzf_read(fp, v->indiv.s, v->indiv.l);
    return 0;
}